

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::register_write(Compiler *this,uint32_t chain)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRExpression *pSVar4;
  SPIRAccessChain *pSVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  bool bVar8;
  SPIRType *type;
  bool check_argument_storage_qualifier;
  SPIRType *chain_type;
  SPIRAccessChain *access_chain;
  SPIRExpression *expr;
  SPIRVariable *var;
  uint32_t chain_local;
  Compiler *this_local;
  
  expr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,chain);
  if (expr == (SPIRExpression *)0x0) {
    pSVar4 = maybe_get<spirv_cross::SPIRExpression>(this,chain);
    if ((pSVar4 != (SPIRExpression *)0x0) &&
       (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->loaded_from), uVar3 != 0)
       ) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->loaded_from);
      expr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,uVar3);
    }
    pSVar5 = maybe_get<spirv_cross::SPIRAccessChain>(this,chain);
    if ((pSVar5 != (SPIRAccessChain *)0x0) &&
       (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->loaded_from), uVar3 != 0)
       ) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->loaded_from);
      expr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,uVar3);
    }
  }
  pSVar6 = expression_type(this,chain);
  if (expr == (SPIRExpression *)0x0) {
    if ((pSVar6->pointer & 1U) != 0) {
      flush_all_active_variables(this);
    }
  }
  else {
    bVar8 = true;
    pSVar6 = expression_type(this,chain);
    pSVar7 = get_variable_data_type(this,(SPIRVariable *)expr);
    if ((pSVar7->pointer & 1U) != 0) {
      flush_all_active_variables(this);
      bVar8 = pSVar6->pointer_depth != 1;
    }
    if ((pSVar6->storage == StorageClassPhysicalStorageBuffer) ||
       (bVar2 = variable_storage_is_aliased(this,(SPIRVariable *)expr), bVar2)) {
      flush_all_aliased_variables(this);
    }
    else if (expr != (SPIRExpression *)0x0) {
      flush_dependees(this,(SPIRVariable *)expr);
    }
    if (((bVar8) &&
        (*(long *)((expr->implied_read_expressions).stack_storage.aligned_char + 0x18) != 0)) &&
       (*(int *)(*(long *)((expr->implied_read_expressions).stack_storage.aligned_char + 0x18) + 0xc
                ) == 0)) {
      lVar1 = *(long *)((expr->implied_read_expressions).stack_storage.aligned_char + 0x18);
      *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
      force_recompile(this);
    }
  }
  return;
}

Assistant:

void Compiler::register_write(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		// If we're storing through an access chain, invalidate the backing variable instead.
		auto *expr = maybe_get<SPIRExpression>(chain);
		if (expr && expr->loaded_from)
			var = maybe_get<SPIRVariable>(expr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain && access_chain->loaded_from)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	auto &chain_type = expression_type(chain);

	if (var)
	{
		bool check_argument_storage_qualifier = true;
		auto &type = expression_type(chain);

		// If our variable is in a storage class which can alias with other buffers,
		// invalidate all variables which depend on aliased variables. And if this is a
		// variable pointer, then invalidate all variables regardless.
		if (get_variable_data_type(*var).pointer)
		{
			flush_all_active_variables();

			if (type.pointer_depth == 1)
			{
				// We have a backing variable which is a pointer-to-pointer type.
				// We are storing some data through a pointer acquired through that variable,
				// but we are not writing to the value of the variable itself,
				// i.e., we are not modifying the pointer directly.
				// If we are storing a non-pointer type (pointer_depth == 1),
				// we know that we are storing some unrelated data.
				// A case here would be
				// void foo(Foo * const *arg) {
				//   Foo *bar = *arg;
				//   bar->unrelated = 42;
				// }
				// arg, the argument is constant.
				check_argument_storage_qualifier = false;
			}
		}

		if (type.storage == StorageClassPhysicalStorageBufferEXT || variable_storage_is_aliased(*var))
			flush_all_aliased_variables();
		else if (var)
			flush_dependees(*var);

		// We tried to write to a parameter which is not marked with out qualifier, force a recompile.
		if (check_argument_storage_qualifier && var->parameter && var->parameter->write_count == 0)
		{
			var->parameter->write_count++;
			force_recompile();
		}
	}
	else if (chain_type.pointer)
	{
		// If we stored through a variable pointer, then we don't know which
		// variable we stored to. So *all* expressions after this point need to
		// be invalidated.
		// FIXME: If we can prove that the variable pointer will point to
		// only certain variables, we can invalidate only those.
		flush_all_active_variables();
	}

	// If chain_type.pointer is false, we're not writing to memory backed variables, but temporaries instead.
	// This can happen in copy_logical_type where we unroll complex reads and writes to temporaries.
}